

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O0

RandSeqProductionSymbol *
slang::ast::RandSeqProductionSymbol::fromSyntax(Scope *scope,ProductionSyntax *syntax)

{
  bool bVar1;
  bitmask<slang::ast::MethodFlags> bVar2;
  int iVar3;
  Compilation *args_1;
  Type *newType;
  undefined4 extraout_var;
  RsRuleSyntax *pRVar4;
  EVP_PKEY_CTX *src;
  Symbol *extraout_RDX;
  SyntaxNode *in_RSI;
  Scope *in_RDI;
  SmallVectorBase<const_slang::ast::FormalArgumentSymbol_*> *in_stack_00000018;
  VariableLifetime in_stack_00000024;
  FunctionPortListSyntax *in_stack_00000028;
  Scope *in_stack_00000030;
  StatementBlockSymbol *ruleBlock;
  RsRuleSyntax *rule;
  const_iterator __end2;
  const_iterator __begin2;
  SeparatedSyntaxList<slang::syntax::RsRuleSyntax> *__range2;
  SmallVector<const_slang::ast::FormalArgumentSymbol_*,_5UL> args;
  RandSeqProductionSymbol *result;
  Compilation *comp;
  SyntaxNode *in_stack_00000548;
  Scope *in_stack_00000550;
  Symbol *in_stack_fffffffffffffee8;
  Scope *in_stack_fffffffffffffef0;
  SmallVectorBase<const_slang::ast::FormalArgumentSymbol_*> *__s;
  undefined6 in_stack_ffffffffffffff00;
  undefined2 in_stack_ffffffffffffff06;
  SourceLocation *in_stack_ffffffffffffff08;
  DeclaredType *this;
  Compilation *args_00;
  BumpAllocator *in_stack_ffffffffffffff20;
  pointer local_98;
  size_t local_90;
  undefined2 in_stack_ffffffffffffff78;
  bitmask<slang::ast::MethodFlags> in_stack_ffffffffffffff7a;
  undefined4 in_stack_ffffffffffffff7c;
  Scope *in_stack_ffffffffffffff80;
  SmallVectorBase<const_slang::ast::FormalArgumentSymbol_*> local_78 [2];
  SourceLocation local_38;
  string_view local_30;
  RandSeqProductionSymbol *local_20;
  Compilation *local_18;
  SyntaxNode *local_10;
  
  local_10 = in_RSI;
  args_1 = Scope::getCompilation(in_RDI);
  args_00 = args_1;
  local_18 = args_1;
  local_30 = parsing::Token::valueText
                       ((Token *)CONCAT26(in_stack_ffffffffffffff06,in_stack_ffffffffffffff00));
  local_38 = parsing::Token::location((Token *)&local_10[1].parent);
  local_20 = BumpAllocator::
             emplace<slang::ast::RandSeqProductionSymbol,slang::ast::Compilation&,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation>
                       (in_stack_ffffffffffffff20,args_00,
                        (basic_string_view<char,_std::char_traits<char>_> *)args_1,
                        in_stack_ffffffffffffff08);
  Symbol::setSyntax(&local_20->super_Symbol,local_10);
  if (*(long *)(local_10 + 1) == 0) {
    this = &local_20->declaredReturnType;
    newType = Compilation::getVoidType(local_18);
    DeclaredType::setType(this,newType);
  }
  else {
    DeclaredType::setTypeSyntax(&local_20->declaredReturnType,*(DataTypeSyntax **)(local_10 + 1));
  }
  if (*(long *)(local_10 + 2) != 0) {
    __s = local_78;
    SmallVector<const_slang::ast::FormalArgumentSymbol_*,_5UL>::SmallVector
              ((SmallVector<const_slang::ast::FormalArgumentSymbol_*,_5UL> *)0x46a52a);
    bVar2 = SubroutineSymbol::buildArguments
                      ((Scope *)ruleBlock,in_stack_00000030,in_stack_00000028,in_stack_00000024,
                       in_stack_00000018);
    in_stack_ffffffffffffff7a = bVar2;
    iVar3 = SmallVectorBase<const_slang::ast::FormalArgumentSymbol_*>::copy
                      (local_78,(EVP_PKEY_CTX *)local_18,src);
    in_stack_fffffffffffffef0 = (Scope *)CONCAT44(extraout_var,iVar3);
    in_stack_fffffffffffffee8 = extraout_RDX;
    std::span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>::
    span<const_slang::ast::FormalArgumentSymbol_*,_18446744073709551615UL>
              ((span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL> *)
               CONCAT26(bVar2.m_bits,in_stack_ffffffffffffff00),
               (span<const_slang::ast::FormalArgumentSymbol_*,_18446744073709551615UL> *)__s);
    (local_20->arguments)._M_ptr = local_98;
    (local_20->arguments)._M_extent._M_extent_value = local_90;
    SmallVector<const_slang::ast::FormalArgumentSymbol_*,_5UL>::~SmallVector
              ((SmallVector<const_slang::ast::FormalArgumentSymbol_*,_5UL> *)0x46a5e2);
  }
  slang::syntax::SeparatedSyntaxList<slang::syntax::RsRuleSyntax>::begin
            ((SeparatedSyntaxList<slang::syntax::RsRuleSyntax> *)0x46a625);
  slang::syntax::SeparatedSyntaxList<slang::syntax::RsRuleSyntax>::end
            ((SeparatedSyntaxList<slang::syntax::RsRuleSyntax> *)0x46a639);
  while( true ) {
    bVar1 = operator==<slang::syntax::SeparatedSyntaxList<slang::syntax::RsRuleSyntax>::iterator_base<const_slang::syntax::RsRuleSyntax_*>_>
                      ((self_type *)in_stack_fffffffffffffef0,
                       (iterator_base<const_slang::syntax::RsRuleSyntax_*> *)
                       in_stack_fffffffffffffee8);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    pRVar4 = iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::RsRuleSyntax>::iterator_base<const_slang::syntax::RsRuleSyntax_*>,_false>
             ::operator*((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::RsRuleSyntax>::iterator_base<const_slang::syntax::RsRuleSyntax_*>,_false>
                          *)0x46a664);
    if ((pRVar4->super_SyntaxNode).previewNode != (SyntaxNode *)0x0) {
      Scope::addMembers(in_stack_00000550,in_stack_00000548);
    }
    StatementBlockSymbol::fromSyntax
              (in_stack_ffffffffffffff80,
               (RsRuleSyntax *)
               CONCAT44(in_stack_ffffffffffffff7c,
                        CONCAT22(in_stack_ffffffffffffff7a.m_bits,in_stack_ffffffffffffff78)));
    Scope::addMember(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
    iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::RsRuleSyntax>::iterator_base<const_slang::syntax::RsRuleSyntax_*>,_false>
    ::
    operator++<slang::syntax::SeparatedSyntaxList<slang::syntax::RsRuleSyntax>::iterator_base<const_slang::syntax::RsRuleSyntax_*>_>
              ((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::RsRuleSyntax>::iterator_base<const_slang::syntax::RsRuleSyntax_*>,_false>
                *)in_stack_fffffffffffffef0);
  }
  return local_20;
}

Assistant:

RandSeqProductionSymbol& RandSeqProductionSymbol::fromSyntax(const Scope& scope,
                                                             const ProductionSyntax& syntax) {
    auto& comp = scope.getCompilation();
    auto result = comp.emplace<RandSeqProductionSymbol>(comp, syntax.name.valueText(),
                                                        syntax.name.location());
    result->setSyntax(syntax);

    if (syntax.dataType)
        result->declaredReturnType.setTypeSyntax(*syntax.dataType);
    else
        result->declaredReturnType.setType(comp.getVoidType());

    if (syntax.portList) {
        SmallVector<const FormalArgumentSymbol*> args;
        SubroutineSymbol::buildArguments(*result, scope, *syntax.portList,
                                         VariableLifetime::Automatic, args);
        result->arguments = args.copy(comp);
    }

    for (auto rule : syntax.rules) {
        if (rule->previewNode)
            result->addMembers(*rule->previewNode);

        auto& ruleBlock = StatementBlockSymbol::fromSyntax(*result, *rule);
        result->addMember(ruleBlock);
    }

    return *result;
}